

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O0

void operator_delete(void *p,nothrow_t *param_2)

{
  bool bVar1;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *pDVar2;
  conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *pcVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  unsigned_long uVar7;
  reference pvVar8;
  reference this;
  Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *in_RSI;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *in_RDI;
  undefined8 *in_FS_OFFSET;
  PagemapEntry *entry;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  p_tame;
  AllocWild<void> p_wild;
  CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  cp;
  SlabMetadata *meta;
  bool result;
  int64_t size;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  r;
  size_t szix;
  size_t ix_1;
  size_t ix_way_1;
  size_t victim_size;
  size_t victim_ix;
  size_t ix;
  size_t ix_way;
  size_t ix_set;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *entry_1;
  CapPtr<snmalloc::BatchedRemoteMessage,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  rmsg;
  size_type in_stack_fffffffffffffae8;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *in_stack_fffffffffffffaf0;
  alloc_id_t in_stack_fffffffffffffaf8;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *key_tweak;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  in_stack_fffffffffffffb00;
  FreeListKey *pFVar9;
  Alloc<RemoteMessage> in_stack_fffffffffffffb08;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  in_stack_fffffffffffffb10;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *pRVar10;
  Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *in_stack_fffffffffffffb18;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  in_stack_fffffffffffffb20;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *pRVar11;
  BackendSlabMetadata *in_stack_fffffffffffffb28;
  PagemapEntry *in_stack_fffffffffffffb30;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *in_stack_fffffffffffffb38;
  Alloc<void> in_stack_fffffffffffffb40;
  address_t in_stack_fffffffffffffb50;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this_00;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *key;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this_01;
  Alloc<void> p_00;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_458;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_450;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_440;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_438;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_428;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_420;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_418;
  ulong local_410;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_408;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_400;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_3f8;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_3f0;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_3e8;
  ulong local_3e0;
  ulong local_3d8;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_3d0;
  ulong local_3c8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_3c0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_3b8;
  ulong local_3a8;
  ulong local_3a0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_390;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_388;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_380;
  undefined1 local_378 [8];
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_370;
  undefined1 *local_368;
  undefined1 local_348 [16];
  undefined1 *local_338;
  LocalState *local_330;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_328;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_320;
  LocalState **local_318;
  undefined1 local_308 [16];
  undefined1 *local_2f8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_2f0 [2];
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_2e0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_2d8;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_2d0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_2c8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_2c0 [3];
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_2a8;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_280;
  undefined1 local_271;
  size_t local_270;
  long local_268;
  undefined2 local_25a;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_258;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_250;
  FreeListKey *local_248;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_240;
  size_t local_238;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_230;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_220;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_218;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_210;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_200;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_1f8;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_1f0;
  ulong local_1e8;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_1e0;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_1d8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_1d0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_1c8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_1c0;
  LocalEntropy *local_1b8;
  FreeListKey *local_1b0;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_1a8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_1a0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_190;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_188;
  enable_if_t<_false,_size_t> local_180;
  ulong local_178;
  ulong local_170;
  enable_if_t<_false,_size_t> local_168;
  ulong local_160;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_158;
  long local_150;
  ulong local_148;
  ulong local_140;
  LocalEntropy *local_138;
  FreeListKey *local_130;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_128;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_120;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_118;
  FreeListKey *local_110;
  FreeListKey *local_108;
  FreeListKey *local_100;
  FreeListKey *local_f8;
  FreeListKey *local_f0;
  FreeListKey *local_e8;
  FreeListKey *local_e0;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_d8;
  FreeListKey *local_d0;
  FreeListKey *local_c8;
  FreeListKey *local_c0;
  FreeListKey *local_b8;
  BatchedRemoteMessage *local_a8;
  BatchedRemoteMessage *local_a0;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_98
  ;
  BatchedRemoteMessage *local_90;
  ulong local_88;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_80;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_78;
  BatchedRemoteMessage *local_70;
  BatchedRemoteMessage *local_68;
  BatchedRemoteMessage *local_60;
  BatchedRemoteMessage **local_58;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_50
  ;
  ulong local_48;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_40
  ;
  value_type_conflict local_38;
  BatchedRemoteMessage *local_30;
  FreeListKey *local_28;
  ulong local_20;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_18;
  value_type_conflict local_10;
  FreeListKey *local_8;
  
  this_00 = *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **)
             *in_FS_OFFSET;
  local_338 = local_348;
  this_01 = in_RDI;
  p_00.unsafe_capptr = in_RDI;
  local_450 = in_RDI;
  local_440 = this_00;
  local_330 = snmalloc::
              Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
              backend_state_ptr(this_00);
  local_328 = local_450;
  local_318 = &local_330;
  local_218 = &local_328;
  local_2f8 = local_308;
  local_320 = local_450;
  local_458 = local_450;
  local_3c0 = local_450;
  local_3b8 = &local_3c0;
  pDVar2 = snmalloc::
           FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
           ::get<false>(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  pcVar3 = snmalloc::
           Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
           public_state(this_00);
  local_3d8 = (pDVar2->
              super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
              ).super_MetaEntryBase.remote_and_sizeclass;
  local_3f0 = pDVar2;
  local_3d0 = pDVar2;
  if (pcVar3 == (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)
                (local_3d8 & 0xffffffffffffff80)) {
    local_438 = &local_458;
    local_2f0[0] = local_458;
    local_200 = local_2f0;
    local_3f8 = local_458;
    local_410 = (pDVar2->
                super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                ).super_MetaEntryBase.meta & 0xfffffffffffffffe;
    local_390 = &local_3f8;
    local_380 = local_458;
    local_368 = local_378;
    local_388 = local_458;
    local_418 = local_458;
    local_420 = local_458;
    local_408 = pDVar2;
    local_400 = this_00;
    local_3e8 = pDVar2;
    local_3e0 = local_410;
    local_3c8 = local_410;
    local_3a8 = local_410;
    local_3a0 = local_410;
    local_370 = local_380;
    snmalloc::freelist::
    Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
    ::add(in_stack_fffffffffffffb18,in_stack_fffffffffffffb20,
          (FreeListKey *)in_stack_fffffffffffffb10.unsafe_capptr,
          (address_t)in_stack_fffffffffffffb08.unsafe_capptr,
          (LocalEntropy *)in_stack_fffffffffffffb00.unsafe_capptr);
    bVar1 = snmalloc::
            FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
            ::return_object((FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                             *)0x13ff47);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_428 = local_3f8;
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow
                (in_stack_fffffffffffffb38,in_stack_fffffffffffffb40,in_stack_fffffffffffffb30,
                 in_stack_fffffffffffffb28);
    }
  }
  else {
    local_2c0[0] = local_458;
    local_1e8 = (pDVar2->
                super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                ).super_MetaEntryBase.remote_and_sizeclass;
    if ((local_1e8 & 0xffffffffffffff80) != 0) {
      local_2a8 = local_2c0;
      local_220 = local_458;
      local_210 = &local_220;
      pRVar11 = &this_00->remote_dealloc_cache;
      local_25a = 1;
      lVar4 = 1;
      key = this_00;
      local_2d0 = pDVar2;
      local_2c8 = this_00;
      local_258 = pDVar2;
      local_250 = pRVar11;
      local_240 = pDVar2;
      local_230 = pDVar2;
      local_1f8 = pDVar2;
      local_1f0 = pDVar2;
      local_1e0 = pDVar2;
      local_270 = (size_t)snmalloc::sizeclass_t::from_raw(in_stack_fffffffffffffae8);
      local_238 = local_270;
      sVar5 = snmalloc::sizeclass_full_to_size((sizeclass_t)in_stack_fffffffffffffb10.unsafe_capptr)
      ;
      local_268 = lVar4 * sVar5;
      local_271 = local_268 < pRVar11->capacity;
      if ((bool)local_271) {
        pRVar11->capacity = pRVar11->capacity - local_268;
        pRVar11 = &this_00->remote_dealloc_cache;
        local_280 = local_2d0;
        local_248 = (FreeListKey *)
                    ((local_2d0->
                     super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                     ).super_MetaEntryBase.meta & 0xfffffffffffffffe);
        local_2d8 = local_2c0[0];
        local_1b8 = &this_00->entropy;
        local_1a0 = local_2c0[0];
        local_1c8 = local_2c0[0];
        local_1b0 = local_248;
        local_1a8 = pRVar11;
        local_1d0 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                     *)snmalloc::freelist::Object::
                       make<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
                                 (in_stack_fffffffffffffb00);
        pRVar10 = &pRVar11->batching;
        local_130 = local_1b0;
        local_138 = local_1b8;
        local_e0 = local_1b0;
        local_d0 = local_1b0;
        local_c0 = local_1b0;
        local_c8 = local_1b0;
        uVar6 = ((ulong)local_1b0 >> 3) * 0x7efb352d >> 0x10;
        local_1d8 = pRVar11;
        local_1c0 = local_1d0;
        local_128 = pRVar10;
        local_120 = pRVar11;
        local_118 = local_1d0;
        local_d8 = pRVar10;
        uVar7 = snmalloc::bits::mask_bits<unsigned_long,unsigned_long>(0x14030b);
        local_140 = uVar6 & uVar7;
        for (local_148 = 0; local_148 < 2; local_148 = local_148 + 1) {
          local_150 = local_140 + local_148;
          local_b8 = local_130;
          pFVar9 = local_130;
          pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                             ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffaf0,
                              in_stack_fffffffffffffae8);
          if (pFVar9 == (FreeListKey *)*pvVar8) {
            std::
            array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
            ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                          *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
            local_158 = local_118;
            local_108 = local_130;
            local_f0 = local_130;
            local_100 = local_130;
            snmalloc::freelist::
            Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            ::add<false>((Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                          *)in_stack_fffffffffffffb08.unsafe_capptr,in_stack_fffffffffffffb10,
                         (FreeListKey *)in_stack_fffffffffffffb00.unsafe_capptr,
                         in_stack_fffffffffffffaf8);
            return;
          }
        }
        local_160 = local_140;
        local_168 = 0;
        for (local_170 = 0; local_170 < 2; local_170 = local_170 + 1) {
          local_178 = local_140 + local_170;
          pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                             ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffaf0,
                              in_stack_fffffffffffffae8);
          if (*pvVar8 == 0) {
            local_160 = local_178;
            break;
          }
          std::
          array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
          ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                        *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
          local_180 = snmalloc::freelist::
                      Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                      ::extract_segment_length<false>
                                ((Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                                  *)0x1404d5);
          if (local_168 < local_180) {
            local_160 = local_178;
            local_168 = local_180;
          }
        }
        pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                           ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffaf0,
                            in_stack_fffffffffffffae8);
        key_tweak = pRVar10;
        if (*pvVar8 != 0) {
          local_188 = local_120;
          local_78 = local_120;
          local_88 = local_160;
          local_80 = pRVar10;
          in_stack_fffffffffffffb08.unsafe_capptr =
               (BatchedRemoteMessage *)
               std::
               array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
               ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                             *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
          pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                             ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffaf0,
                              in_stack_fffffffffffffae8);
          local_38 = *pvVar8;
          local_a0 = (BatchedRemoteMessage *)
                     snmalloc::BatchedRemoteMessage::mk_from_freelist_builder
                               (in_RSI,(FreeListKey *)key,in_stack_fffffffffffffb50);
          local_58 = &local_68;
          local_90 = local_a0;
          local_70 = local_a0;
          local_68 = local_a0;
          local_60 = local_a0;
          local_30 = local_a0;
          local_98 = snmalloc::
                     FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
                     ::get<false>(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
          local_48 = (local_98->
                     super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                     ).super_MetaEntryBase.remote_and_sizeclass;
          local_50 = local_98;
          local_40 = local_98;
          snmalloc::RemoteAllocator::trunc_id((RemoteAllocator *)(local_48 & 0xffffffffffffff80));
          local_a8 = local_90;
          snmalloc::
          RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
          ::dealloc<9216UL>::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffb00.unsafe_capptr,
                     in_stack_fffffffffffffaf8,in_stack_fffffffffffffb08);
          pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                             ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffaf0,
                              in_stack_fffffffffffffae8);
          *pvVar8 = 0;
          in_stack_fffffffffffffb10.unsafe_capptr =
               (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                *)pRVar10;
        }
        local_20 = local_160;
        local_28 = local_130;
        local_18 = key_tweak;
        this = std::
               array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
               ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                             *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                           ((array<unsigned_long,_16UL> *)this,in_stack_fffffffffffffae8);
        local_10 = *pvVar8;
        snmalloc::freelist::
        Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
        ::init(this,(EVP_PKEY_CTX *)0x0);
        local_8 = local_28;
        pFVar9 = local_28;
        pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                           ((array<unsigned_long,_16UL> *)this,in_stack_fffffffffffffae8);
        *pvVar8 = (value_type_conflict)pFVar9;
        std::
        array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
        ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                      *)this,in_stack_fffffffffffffae8);
        local_190 = local_118;
        local_110 = local_130;
        local_e8 = local_130;
        local_f8 = local_130;
        snmalloc::freelist::
        Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
        ::add<false>((Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                      *)in_stack_fffffffffffffb08.unsafe_capptr,in_stack_fffffffffffffb10,pFVar9,
                     (address_t)key_tweak);
      }
      else {
        local_2e0 = local_2c0[0];
        snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
        ::dealloc_remote_slow<snmalloc::CheckInitPthread>(this_01,(PagemapEntry *)in_RDI,p_00);
      }
    }
  }
  return;
}

Assistant:

void operator delete(void* p, std::nothrow_t&)
{
  snmalloc::libc::free(p);
}